

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::
basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::hex_writer>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::internal::output_range<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>::int_writer<char,fmt::v6::basic_format_specs<char>>::hex_writer>
             *this,char **it)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  char *digits;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  size_t __len;
  char *pcVar7;
  ptrdiff_t _Num;
  
  sVar2 = *(size_t *)(this + 0x10);
  if (sVar2 != 0) {
    pcVar7 = *it;
    memmove(pcVar7,*(void **)(this + 8),sVar2);
    *it = pcVar7 + sVar2;
  }
  pcVar5 = *it;
  sVar2 = *(size_t *)(this + 0x20);
  pcVar7 = pcVar5;
  if (sVar2 != 0) {
    pcVar7 = pcVar5 + sVar2;
    memset(pcVar5,*(int *)(this + 0x18),sVar2);
  }
  *it = pcVar7;
  iVar1 = *(int *)(this + 0x30);
  if (*(char *)(*(long *)(*(long *)(this + 0x28) + 8) + 8) == 'x') {
    pcVar4 = "0123456789abcdef";
  }
  else {
    pcVar4 = "0123456789ABCDEF";
  }
  pcVar5 = pcVar5 + sVar2 + (long)iVar1;
  uVar6 = *(uint *)(*(long *)(this + 0x28) + 0x10);
  do {
    pcVar5 = pcVar5 + -1;
    *pcVar5 = pcVar4[uVar6 & 0xf];
    bVar3 = 0xf < uVar6;
    uVar6 = uVar6 >> 4;
  } while (bVar3);
  *it = pcVar7 + iVar1;
  return;
}

Assistant:

void operator()(It&& it) const {
      if (prefix.size() != 0)
        it = copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }